

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O0

uint160 * Hash160<CPubKey>(CPubKey *in1)

{
  Span<const_unsigned_char> input;
  CHash160 *this;
  uint160 *in_RDI;
  long in_FS_OFFSET;
  Span<const_unsigned_char> output;
  uint160 *result;
  CHash160 *in_stack_ffffffffffffff38;
  Span<unsigned_char> *this_00;
  uint160 *puVar1;
  size_t in_stack_ffffffffffffff58;
  Span<unsigned_char> local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  puVar1 = in_RDI;
  uint160::uint160((uint160 *)in_stack_ffffffffffffff38);
  local_28 = 0;
  uStack_20 = 0;
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78.m_data = (uchar *)0x0;
  local_78.m_size = 0;
  local_18 = 0;
  this_00 = &local_78;
  CHash160::CHash160(in_stack_ffffffffffffff38);
  output = MakeUCharSpan<CPubKey_const&>((CPubKey *)this_00);
  input.m_size = in_stack_ffffffffffffff58;
  input.m_data = (uchar *)puVar1;
  this = CHash160::Write((CHash160 *)this_00,input);
  Span<unsigned_char>::Span<uint160>(this_00,in_RDI,in_stack_ffffffffffffff38);
  CHash160::Finalize(this,(Span<unsigned_char>)output);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

inline uint160 Hash160(const T1& in1)
{
    uint160 result;
    CHash160().Write(MakeUCharSpan(in1)).Finalize(result);
    return result;
}